

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined1 local_b0 [8];
  string fname;
  string *LinkExtension;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_60 [8];
  string ext;
  string lib;
  string *dir_local;
  cmOrderDirectoriesConstraintLibrary *this_local;
  
  bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,
                     &(this->super_cmOrderDirectoriesConstraint).FileName);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&((this->super_cmOrderDirectoriesConstraint).OD)->LinkExtensions);
    if ((!bVar1) &&
       (bVar1 = cmsys::RegularExpression::find
                          (&((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,
                           &(this->super_cmOrderDirectoriesConstraint).FileName), bVar1)) {
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)((long)&ext.field_2 + 8),
                 &((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,1);
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)local_60,
                 &((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,2);
      this_00 = &((this->super_cmOrderDirectoriesConstraint).OD)->LinkExtensions;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      LinkExtension =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&LinkExtension), bVar1) {
        fname.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )fname.field_2._8_8_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
        if (bVar1) {
          cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                    ((string *)local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ext.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     fname.field_2._8_8_);
          bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                            (&this->super_cmOrderDirectoriesConstraint,dir,(string *)local_b0);
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          std::__cxx11::string::~string((string *)local_b0);
          if (bVar1) goto LAB_00ad0f3b;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      bVar1 = false;
LAB_00ad0f3b:
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
      if (bVar1 != false) goto LAB_00ad0f75;
    }
    this_local._7_1_ = 0;
  }
LAB_00ad0f75:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if (this->FileMayConflict(dir, this->FileName)) {
    return true;
  }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if (!this->OD->LinkExtensions.empty() &&
      this->OD->RemoveLibraryExtension.find(this->FileName)) {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for (std::string const& LinkExtension : this->OD->LinkExtensions) {
      if (LinkExtension != ext) {
        std::string fname = cmStrCat(lib, LinkExtension);
        if (this->FileMayConflict(dir, fname)) {
          return true;
        }
      }
    }
  }
  return false;
}